

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

bool YAML::convert<bool>::decode(Node *node,bool *rhs)

{
  char cVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  string *str;
  long lVar5;
  anon_struct_64_2_16624fb6 *__lhs;
  allocator local_5f;
  allocator local_5e;
  allocator local_5d;
  allocator local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  bool *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = Node::IsScalar(node);
  if (bVar2) {
    if ((decode(YAML::Node_const&,bool&)::names == '\0') &&
       (iVar4 = __cxa_guard_acquire(&decode(YAML::Node_const&,bool&)::names), iVar4 != 0)) {
      std::__cxx11::string::string((string *)decode::names,"y",(allocator *)&local_50);
      std::__cxx11::string::string((string *)&decode::names[0].falsename,"n",&local_59);
      std::__cxx11::string::string((string *)(decode::names + 1),"yes",&local_5a);
      std::__cxx11::string::string((string *)&decode::names[1].falsename,"no",&local_5b);
      std::__cxx11::string::string((string *)(decode::names + 2),"true",&local_5c);
      std::__cxx11::string::string((string *)&decode::names[2].falsename,"false",&local_5d);
      std::__cxx11::string::string((string *)(decode::names + 3),"on",&local_5e);
      std::__cxx11::string::string((string *)&decode::names[3].falsename,"off",&local_5f);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&decode(YAML::Node_const&,bool&)::names);
    }
    str = Node::Scalar_abi_cxx11_(node);
    if ((str->_M_string_length != 0) &&
       (bVar2 = (anonymous_namespace)::IsEntirely<bool(*)(char)>
                          (str,anon_unknown.dwarf_10465aa::IsLower), !bVar2)) {
      cVar1 = *(str->_M_dataplus)._M_p;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_00699ea1;
      }
      bVar2 = (anonymous_namespace)::IsEntirely<bool(*)(char)>
                        (&local_50,anon_unknown.dwarf_10465aa::IsLower);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        bVar2 = (anonymous_namespace)::IsEntirely<bool(*)(char)>
                          (&local_50,anon_unknown.dwarf_10465aa::IsUpper);
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar2) goto LAB_00699ea1;
      }
    }
    lVar5 = 0x100;
    __lhs = decode::names;
    local_58 = rhs;
    do {
      if (lVar5 == 0) goto LAB_00699ea1;
      Node::Scalar_abi_cxx11_(node);
      iVar4 = (int)&local_50;
      anon_unknown.dwarf_10465aa::tolower(iVar4);
      _Var3 = std::operator==(&__lhs->truename,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var3) {
        *local_58 = true;
        goto LAB_00699e93;
      }
      Node::Scalar_abi_cxx11_(node);
      anon_unknown.dwarf_10465aa::tolower(iVar4);
      _Var3 = std::operator==(&__lhs->falsename,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar5 = lVar5 + -0x40;
      __lhs = __lhs + 1;
    } while (!_Var3);
    *local_58 = false;
LAB_00699e93:
    bVar2 = true;
  }
  else {
LAB_00699ea1:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool convert<bool>::decode(const Node& node, bool& rhs) {
  if (!node.IsScalar())
    return false;

  // we can't use iostream bool extraction operators as they don't
  // recognize all possible values in the table below (taken from
  // http://yaml.org/type/bool.html)
  static const struct {
    std::string truename, falsename;
  } names[] = {
      {"y", "n"},
      {"yes", "no"},
      {"true", "false"},
      {"on", "off"},
  };

  if (!IsFlexibleCase(node.Scalar()))
    return false;

  for (const auto& name : names) {
    if (name.truename == tolower(node.Scalar())) {
      rhs = true;
      return true;
    }

    if (name.falsename == tolower(node.Scalar())) {
      rhs = false;
      return true;
    }
  }

  return false;
}